

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

QHostInfo qt_qhostinfo_lookup(QString *name,QObject *receiver,char *member,bool *valid,int *id)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  QHostInfoCache *in_RCX;
  QHostInfoPrivate *in_RDI;
  QString *in_R8;
  bool *in_R9;
  char *unaff_retaddr;
  QSlotObjectBase *in_stack_00000008;
  QObject *in_stack_00000010;
  QString *in_stack_00000018;
  QHostInfoLookupManager *manager;
  QHostInfo *info;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
  *in_stack_ffffffffffffffa8;
  QHostInfoPrivate *pQVar4;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  uint in_stack_ffffffffffffffc4;
  
  *(undefined1 *)&(in_R8->d).d = 0;
  in_R9[0] = true;
  in_R9[1] = true;
  in_R9[2] = true;
  in_R9[3] = true;
  pQVar4 = in_RDI;
  pTVar3 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
           ::operator()(in_stack_ffffffffffffffa8);
  if ((pTVar3 != (Type *)0x0) &&
     (bVar1 = QHostInfoCache::isEnabled((QHostInfoCache *)0x21efe9), bVar1)) {
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
    QHostInfoCache::get(in_RCX,in_R8,in_R9);
    bVar1 = ((ulong)(in_R8->d).d & 1) != 0;
    if (bVar1) {
      in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    }
    uVar5 = (uint)bVar1;
    if ((in_stack_ffffffffffffffc4 & 0x1000000) == 0) {
      QHostInfo::~QHostInfo((QHostInfo *)in_RDI);
    }
    if (uVar5 != 0) {
      return (QHostInfo)pQVar4;
    }
    in_stack_ffffffffffffffc0 = 0;
  }
  iVar2 = QHostInfo::lookupHostImpl
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *(int *)in_R9 = iVar2;
  QHostInfo::QHostInfo
            ((QHostInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)pQVar4 >> 0x20));
  return (QHostInfo)pQVar4;
}

Assistant:

QHostInfo qt_qhostinfo_lookup(const QString &name, QObject *receiver, const char *member, bool *valid, int *id)
{
    *valid = false;
    *id = -1;

    // check cache
    QHostInfoLookupManager* manager = theHostInfoLookupManager();
    if (manager && manager->cache.isEnabled()) {
        QHostInfo info = manager->cache.get(name, valid);
        if (*valid) {
            return info;
        }
    }

    // was not in cache, trigger lookup
    *id = QHostInfo::lookupHostImpl(name, receiver, nullptr, member);

    // return empty response, valid==false
    return QHostInfo();
}